

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumberParser.cpp
# Opt level: O3

int __thiscall slang::parsing::NumberParser::append(NumberParser *this,Token token,bool isFirst)

{
  byte bVar1;
  size_t sVar2;
  SourceLocation location;
  size_t sVar3;
  char cVar4;
  logic_t lVar5;
  uint maxValue;
  uint uVar6;
  ulong uVar7;
  byte bVar8;
  SourceLocation extraout_RDX;
  uint8_t *puVar9;
  SourceLocation SVar10;
  SourceLocation extraout_RDX_00;
  long lVar11;
  DiagCode code;
  Diagnostics *this_00;
  byte *pbVar12;
  string_view sVar13;
  Token local_50;
  Token local_40;
  
  local_40.info = token.info;
  local_40._0_8_ = token._0_8_;
  sVar13 = Token::rawText(&local_40);
  SmallVectorBase<char>::append<const_char_*>
            (&(this->text).super_SmallVectorBase<char>,sVar13._M_str,sVar13._M_str + sVar13._M_len);
  if (this->valid != true) {
    return -1;
  }
  this->valid = false;
  sVar13 = Token::rawText(&local_40);
  pbVar12 = (byte *)sVar13._M_str;
  sVar2 = sVar13._M_len;
  location = Token::location(&local_40);
  if ((sVar2 != 0 && isFirst) && (*pbVar12 == 0x5f)) {
    this_00 = this->diagnostics;
    code.subsystem = Numeric;
    code.code = 0;
LAB_003a31f7:
    Diagnostics::add(this_00,code,location);
    return -1;
  }
  maxValue = location._0_4_;
  switch(this->literalBase) {
  case Binary:
    if (sVar2 != 0) {
      sVar3 = 0;
      SVar10 = location;
      do {
        bVar8 = pbVar12[sVar3];
        uVar6 = bVar8 - 0x3f;
        if (uVar6 < 0x3c) {
          SVar10 = (SourceLocation)&logic_t::z;
          if ((0x800000008000001U >> ((ulong)uVar6 & 0x3f) & 1) == 0) {
            SVar10 = (SourceLocation)0x200000002000000;
            if ((0x200000002000000U >> ((ulong)uVar6 & 0x3f) & 1) == 0) goto LAB_003a3288;
            SVar10 = (SourceLocation)&logic_t::x;
          }
          lVar5.value = *(uint8_t *)SVar10;
LAB_003a3270:
          addDigit(this,lVar5,SVar10._0_4_);
          SVar10 = extraout_RDX;
        }
        else {
LAB_003a3288:
          if ((bVar8 & 0xfe) == 0x30) {
            lVar5.value = bVar8 - 0x30;
            goto LAB_003a3270;
          }
          if (bVar8 != 0x5f) {
            location = (SourceLocation)
                       ((long)((int)((ulong)location >> 0x1c) + (int)sVar3) << 0x1c |
                       (ulong)(maxValue & 0xfffffff));
            this_00 = this->diagnostics;
            code.subsystem = Lexer;
            code.code = 0;
            goto LAB_003a31f7;
          }
        }
        sVar3 = sVar3 + 1;
      } while (sVar2 != sVar3);
    }
    break;
  case Octal:
    if (sVar2 != 0) {
      sVar3 = 0;
      SVar10 = location;
      do {
        bVar8 = pbVar12[sVar3];
        uVar6 = bVar8 - 0x3f;
        if (uVar6 < 0x3c) {
          SVar10 = (SourceLocation)&logic_t::z;
          if ((0x800000008000001U >> ((ulong)uVar6 & 0x3f) & 1) == 0) {
            SVar10 = (SourceLocation)0x200000002000000;
            if ((0x200000002000000U >> ((ulong)uVar6 & 0x3f) & 1) == 0) goto LAB_003a3451;
            SVar10 = (SourceLocation)&logic_t::x;
          }
          lVar5.value = *(uint8_t *)SVar10;
LAB_003a3439:
          addDigit(this,lVar5,SVar10._0_4_);
          SVar10 = extraout_RDX_00;
        }
        else {
LAB_003a3451:
          if ((bVar8 & 0xf8) == 0x30) {
            lVar5.value = bVar8 - 0x30;
            goto LAB_003a3439;
          }
          if (bVar8 != 0x5f) {
            location = (SourceLocation)
                       ((long)((int)((ulong)location >> 0x1c) + (int)sVar3) << 0x1c |
                       (ulong)(maxValue & 0xfffffff));
            this_00 = this->diagnostics;
            code.subsystem = Lexer;
            code.code = 3;
            goto LAB_003a31f7;
          }
        }
        sVar3 = sVar3 + 1;
      } while (sVar2 != sVar3);
    }
    break;
  case Decimal:
    if (isFirst) {
      if ((sVar2 == 1) && (uVar6 = *pbVar12 - 0x3f, uVar6 < 0x3c)) {
        if ((0x800000008000001U >> ((ulong)uVar6 & 0x3f) & 1) == 0) {
          if ((0x200000002000000U >> ((ulong)uVar6 & 0x3f) & 1) == 0) goto LAB_003a34b3;
          puVar9 = &logic_t::x;
        }
        else {
          puVar9 = "@";
        }
        addDigit(this,(logic_t)*puVar9,maxValue);
        break;
      }
LAB_003a34b3:
      if (local_40.kind == IntegerLiteral) {
        Token::intValue(&local_50);
        SVInt::operator=(&this->decimalValue,(SVInt *)&local_50);
        if (((0x40 < (uint)local_50.info) || ((local_50.info._5_1_ & 1) != 0)) &&
           ((void *)local_50._0_8_ != (void *)0x0)) {
          operator_delete__((void *)local_50._0_8_);
        }
        break;
      }
    }
    if (sVar2 != 0) {
      bVar8 = this->hasUnknown;
      sVar3 = 0;
      do {
        bVar1 = pbVar12[sVar3];
        uVar6 = bVar1 - 0x3f;
        if (((uVar6 < 0x3c) && ((0xa0000000a000001U >> ((ulong)uVar6 & 0x3f) & 1) != 0)) ||
           ((byte)(bVar1 - 0x30) < 10)) {
          if ((bVar8 & 1) != 0) {
            location = (SourceLocation)
                       ((long)((int)((ulong)location >> 0x1c) + (int)sVar3) << 0x1c |
                       (ulong)(maxValue & 0xfffffff));
            this_00 = this->diagnostics;
            code.subsystem = Lexer;
            code.code = 4;
            goto LAB_003a31f7;
          }
          if ((0x3b < uVar6) ||
             (bVar8 = true, (0xa0000000a000001U >> ((ulong)uVar6 & 0x3f) & 1) == 0)) {
            bVar8 = false;
          }
          this->hasUnknown = (bool)bVar8;
        }
        else if (bVar1 != 0x5f) {
          location = (SourceLocation)
                     ((long)((int)((ulong)location >> 0x1c) + (int)sVar3) << 0x1c |
                     (ulong)(maxValue & 0xfffffff));
          this_00 = this->diagnostics;
          code.subsystem = Lexer;
          code.code = 1;
          goto LAB_003a31f7;
        }
        sVar3 = sVar3 + 1;
      } while (sVar2 != sVar3);
    }
    break;
  case Hex:
    if (sVar2 != 0) {
      lVar11 = 0;
      do {
        bVar8 = *pbVar12;
        uVar6 = bVar8 - 0x3f;
        if (uVar6 < 0x3c) {
          puVar9 = "@";
          if ((0x800000008000001U >> ((ulong)uVar6 & 0x3f) & 1) == 0) {
            if ((0x200000002000000U >> ((ulong)uVar6 & 0x3f) & 1) == 0) goto LAB_003a3370;
            puVar9 = &logic_t::x;
          }
          lVar5.value = *puVar9;
LAB_003a3355:
          addDigit(this,lVar5,(int)puVar9);
        }
        else {
LAB_003a3370:
          if ((byte)(bVar8 - 0x30) < 10) {
LAB_003a3394:
            cVar4 = (bVar8 < 0x47) * ' ' + -0x57;
            puVar9 = (uint8_t *)0xd0;
            if (bVar8 < 0x3a) {
              cVar4 = -0x30;
            }
            lVar5.value = cVar4 + bVar8;
            goto LAB_003a3355;
          }
          uVar7 = (ulong)(bVar8 - 0x2b);
          if (0x3b < bVar8 - 0x2b) {
LAB_003a35c2:
            location = (SourceLocation)
                       ((long)((int)((ulong)location >> 0x1c) - (int)lVar11) << 0x1c |
                       (ulong)(maxValue & 0xfffffff));
            this_00 = this->diagnostics;
            code.subsystem = Lexer;
            code.code = 2;
            goto LAB_003a31f7;
          }
          if ((0xfc000000fc00000U >> (uVar7 & 0x3f) & 1) != 0) goto LAB_003a3394;
          if (uVar7 != 0x34) {
            if ((5UL >> (uVar7 & 0x3f) & 1) != 0) {
              SmallVectorBase<char>::resizeImpl<slang::SmallVectorBase<char>::ValueInitTag>
                        (&(this->text).super_SmallVectorBase<char>,
                         ((this->text).super_SmallVectorBase<char>.len - sVar2) - lVar11,
                         (ValueInitTag *)&local_50);
              this->valid = true;
              return -(int)lVar11;
            }
            goto LAB_003a35c2;
          }
        }
        pbVar12 = pbVar12 + 1;
        lVar11 = lVar11 + -1;
      } while (-lVar11 != sVar2);
    }
  }
  this->valid = true;
  return -1;
}

Assistant:

int NumberParser::append(Token token, bool isFirst) {
    text.append_range(token.rawText());

    // If we've had an error thus far, don't bother doing anything else that
    // might just add more errors on the pile.
    if (!valid)
        return -1;

    // set valid to false since we return early when we encounter errors
    // if we're still good at the end of the function we'll flip this back
    valid = false;

    // underscore as the first char is not allowed
    std::string_view chars = token.rawText();
    SourceLocation location = token.location();
    if (isFirst && chars.length() && chars[0] == '_') {
        addDiag(diag::DigitsLeadingUnderscore, location);
        return -1;
    }

    int index = 0;
    switch (literalBase) {
        case LiteralBase::Binary:
            for (char c : chars) {
                if (isLogicDigit(c))
                    addDigit(getLogicCharValue(c), 2);
                else if (isBinaryDigit(c))
                    addDigit(logic_t(getDigitValue(c)), 2);
                else if (c != '_') {
                    addDiag(diag::BadBinaryDigit, location + index);
                    return -1;
                }
                index++;
            }
            break;
        case LiteralBase::Octal:
            for (char c : chars) {
                if (isLogicDigit(c))
                    addDigit(getLogicCharValue(c), 8);
                else if (isOctalDigit(c))
                    addDigit(logic_t(getDigitValue(c)), 8);
                else if (c != '_') {
                    addDiag(diag::BadOctalDigit, location + index);
                    return -1;
                }
                index++;
            }
            break;
        case LiteralBase::Decimal:
            // Decimals have the restriction that you can only use x or z if it's the only digit.
            // Further, they can obviously only have decimal numbers (not A-F letters). Combined,
            // this means that we should only ever see one token here in practice, unless there's
            // an error. Optimize for this case and just suck the decimal value that's already
            // been computed out of the token itself.
            if (isFirst) {
                if (chars.length() == 1 && isLogicDigit(chars[0])) {
                    addDigit(getLogicCharValue(chars[0]), 10);
                    break;
                }

                if (token.kind == TokenKind::IntegerLiteral) {
                    decimalValue = token.intValue();
                    break;
                }
            }

            // As mentioned above, this loop is just for checking errors.
            for (char c : chars) {
                if (isLogicDigit(c) || isDecimalDigit(c)) {
                    if (hasUnknown) {
                        addDiag(diag::DecimalDigitMultipleUnknown, location + index);
                        return -1;
                    }

                    hasUnknown = isLogicDigit(c);
                }
                else if (c != '_') {
                    addDiag(diag::BadDecimalDigit, location + index);
                    return -1;
                }
                index++;
            }
            break;
        case LiteralBase::Hex:
            for (char c : chars) {
                if (isLogicDigit(c))
                    addDigit(getLogicCharValue(c), 16);
                else if (isHexDigit(c))
                    addDigit(logic_t(getHexDigitValue(c)), 16);
                else if (c == '+' || c == '-') {
                    // This is ok, this was initially lexed as a real token with exponent.
                    // Slice off everything after and including the operator, which will
                    // become new tokens.
                    text.resize(text.size() - (chars.size() - size_t(index)));
                    valid = true;
                    return index;
                }
                else if (c != '_') {
                    addDiag(diag::BadHexDigit, location + index);
                    return -1;
                }
                index++;
            }
            break;
    }

    valid = true;
    return -1;
}